

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::MatrixBandPartLayerParams::SerializeWithCachedSizes
          (MatrixBandPartLayerParams *this,CodedOutputStream *output)

{
  if (this->numlower_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt64(1,this->numlower_,output);
  }
  if (this->numupper_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt64(2,this->numupper_,output);
    return;
  }
  return;
}

Assistant:

void MatrixBandPartLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.MatrixBandPartLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 numLower = 1;
  if (this->numlower() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(1, this->numlower(), output);
  }

  // int64 numUpper = 2;
  if (this->numupper() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(2, this->numupper(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.MatrixBandPartLayerParams)
}